

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,ITestCase *testCase,string *className,string *name,string *description
          ,SourceLineInfo *lineInfo)

{
  string *s;
  bool bVar1;
  allocator<char> local_c1;
  string local_c0;
  TagExtracter local_a0;
  allocator<char> local_69;
  string local_68;
  SourceLineInfo *local_38;
  SourceLineInfo *lineInfo_local;
  string *description_local;
  string *name_local;
  string *className_local;
  ITestCase *testCase_local;
  TestCaseInfo *this_local;
  
  local_38 = lineInfo;
  lineInfo_local = (SourceLineInfo *)description;
  description_local = name;
  name_local = className;
  className_local = (string *)testCase;
  testCase_local = (ITestCase *)this;
  Ptr<Catch::ITestCase>::Ptr(&this->m_test,testCase);
  std::__cxx11::string::string((string *)&this->m_className,(string *)name_local);
  std::__cxx11::string::string((string *)&this->m_name,(string *)description_local);
  std::__cxx11::string::string((string *)&this->m_description,(string *)lineInfo_local);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_tags);
  SourceLineInfo::SourceLineInfo(&this->m_lineInfo,local_38);
  s = description_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"./",&local_69);
  bVar1 = startsWith(s,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  this->m_isHidden = bVar1;
  TagExtracter::TagExtracter(&local_a0,&this->m_tags);
  TagExtracter::parse(&local_a0,&this->m_description);
  TagExtracter::~TagExtracter(&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"hide",&local_c1);
  bVar1 = hasTag(this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  if (bVar1) {
    this->m_isHidden = true;
  }
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( ITestCase* testCase,
                                const std::string& className,
                                const std::string& name,
                                const std::string& description,
                                const SourceLineInfo& lineInfo )
    :   m_test( testCase ),
        m_className( className ),
        m_name( name ),
        m_description( description ),
        m_lineInfo( lineInfo ),
        m_isHidden( startsWith( name, "./" ) )
    {
        TagExtracter( m_tags ).parse( m_description );
        if( hasTag( "hide" ) )
            m_isHidden = true;
    }